

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O0

bool __thiscall QCacheItem::canCompress(QCacheItem *this)

{
  bool bVar1;
  qlonglong qVar2;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  qint64 size;
  QByteArrayView type;
  QByteArrayView sizeValue;
  QHttpHeaders h;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  bool *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar3;
  QByteArrayView in_stack_ffffffffffffff70;
  QByteArrayView in_stack_ffffffffffffff80;
  QByteArrayView local_50;
  QByteArrayView local_40;
  QByteArrayView local_30;
  QByteArrayView local_20;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::headers
            ((QNetworkCacheMetaData *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  local_20.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
  local_20.m_size = 0xaaaaaaaaaaaaaaaa;
  QByteArrayView::QByteArrayView(&local_30);
  local_20 = QHttpHeaders::value((QHttpHeaders *)
                                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                                 (WellKnownHeader)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff80)
  ;
  bVar1 = QByteArrayView::empty((QByteArrayView *)0x2812cc);
  if (bVar1) {
    bVar3 = 0;
    goto LAB_00281450;
  }
  qVar2 = QByteArrayView::toLongLong
                    ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                     ,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  if (0x300000 < qVar2) {
    bVar3 = 0;
    goto LAB_00281450;
  }
  local_40.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
  local_40.m_size = 0xaaaaaaaaaaaaaaaa;
  QByteArrayView::QByteArrayView(&local_50);
  local_40 = QHttpHeaders::value((QHttpHeaders *)
                                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                                 (WellKnownHeader)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff80)
  ;
  bVar1 = QByteArrayView::empty((QByteArrayView *)0x281374);
  if (!bVar1) {
    bVar3 = 0;
    goto LAB_00281450;
  }
  QByteArrayView::QByteArrayView<6ul>
            (in_RDI,(char (*) [6])CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  bVar1 = QByteArrayView::startsWith
                    ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                     ,in_stack_ffffffffffffff70);
  if (!bVar1) {
    QByteArrayView::QByteArrayView<13ul>
              (in_RDI,(char (*) [13])CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    bVar1 = QByteArrayView::startsWith
                      ((QByteArrayView *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff70);
    if (!bVar1) {
LAB_00281434:
      bVar3 = 0;
      goto LAB_00281450;
    }
    QByteArrayView::QByteArrayView<11ul>
              (in_RDI,(char (*) [11])CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    bVar1 = QByteArrayView::endsWith
                      ((QByteArrayView *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff70);
    if (!bVar1) {
      QByteArrayView::QByteArrayView<11ul>
                (in_RDI,(char (*) [11])CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                );
      bVar1 = QByteArrayView::endsWith
                        ((QByteArrayView *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff70);
      if (!bVar1) goto LAB_00281434;
    }
  }
  bVar3 = 1;
LAB_00281450:
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x28145d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool QCacheItem::canCompress() const
{
    const auto h = metaData.headers();

    const auto sizeValue = h.value(QHttpHeaders::WellKnownHeader::ContentLength);
    if (sizeValue.empty())
        return false;

    qint64 size = sizeValue.toLongLong();
    if (size > MAX_COMPRESSION_SIZE)
        return false;

    const auto type = h.value(QHttpHeaders::WellKnownHeader::ContentType);
    if (!type.empty())
        return false;

    if (!type.startsWith("text/")
        && !(type.startsWith("application/")
            && (type.endsWith("javascript") || type.endsWith("ecmascript")))) {
        return false;
    }

    return true;
}